

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

char * Prs_ObjGetName(Prs_Ntk_t *p,int NameId)

{
  int iVar1;
  Vec_Str_t *p_00;
  char *pName;
  int NameId_local;
  Prs_Ntk_t *p_local;
  
  p_local = (Prs_Ntk_t *)Prs_NtkStr(p,NameId);
  if ((p_local != (Prs_Ntk_t *)0x0) &&
     (iVar1 = Prs_NameIsLegalInVerilog((char *)p_local,NameId), iVar1 == 0)) {
    p_00 = Abc_NamBuffer(p->pStrs);
    p_local = (Prs_Ntk_t *)Vec_StrPrintF(p_00,"\\%s ",p_local);
  }
  return (char *)p_local;
}

Assistant:

char * Prs_ObjGetName( Prs_Ntk_t * p, int NameId )
{
    char * pName = Prs_NtkStr(p, NameId);
    if ( pName == NULL )
        return pName;
    if ( Prs_NameIsLegalInVerilog(pName, NameId) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "\\%s ", pName );
}